

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O2

void __thiscall SchnorrPubkey_Constructor_Test::TestBody(SchnorrPubkey_Constructor_Test *this)

{
  byte bVar1;
  char *pcVar2;
  char *in_R9;
  AssertHelper AStack_c8;
  AssertionResult gtest_ar;
  string local_b0;
  AssertionResult gtest_ar_;
  SchnorrPubkey b256_obj;
  SchnorrPubkey sk_obj;
  SchnorrPubkey sk_pubkey;
  SchnorrPubkey empty_obj;
  
  cfd::core::SchnorrPubkey::FromPrivkey((Privkey *)&sk_pubkey,(bool *)&sk);
  cfd::core::SchnorrPubkey::SchnorrPubkey(&empty_obj);
  bVar1 = cfd::core::SchnorrPubkey::IsValid();
  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1 != 0) {
    testing::Message::Message((Message *)&sk_obj);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,(internal *)&gtest_ar_,(AssertionResult *)"empty_obj.IsValid()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&b256_obj,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xa7,local_b0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&b256_obj,(Message *)&sk_obj);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&b256_obj);
    std::__cxx11::string::~string((string *)&local_b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&sk_obj);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  cfd::core::SchnorrPubkey::FromPrivkey((Privkey *)&sk_obj,(bool *)&sk);
  cfd::core::SchnorrPubkey::GetData();
  cfd::core::ByteData256::ByteData256((ByteData256 *)&local_b0,(ByteData *)&gtest_ar_);
  cfd::core::SchnorrPubkey::SchnorrPubkey(&b256_obj,(ByteData256 *)&local_b0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar_);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_();
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"sk_pubkey.GetHex()","sk_obj.GetHex()",&local_b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__cxx11::string::~string((string *)&local_b0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_b0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xac,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_();
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"sk_pubkey.GetHex()","b256_obj.GetHex()",&local_b0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar_);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__cxx11::string::~string((string *)&local_b0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_b0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xad,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_.success_ = (bool)cfd::core::SchnorrPubkey::IsValid();
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,(internal *)&gtest_ar_,(AssertionResult *)"sk_obj.IsValid()","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xae,local_b0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&AStack_c8);
    std::__cxx11::string::~string((string *)&local_b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = (bool)cfd::core::SchnorrPubkey::IsValid();
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,(internal *)&gtest_ar_,(AssertionResult *)"b256_obj.IsValid()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xaf,local_b0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&AStack_c8);
    std::__cxx11::string::~string((string *)&local_b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = (bool)cfd::core::SchnorrPubkey::Equals(&sk_obj);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,(internal *)&gtest_ar_,(AssertionResult *)"sk_obj.Equals(b256_obj)","false"
               ,"true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xb0,local_b0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_c8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&AStack_c8);
    std::__cxx11::string::~string((string *)&local_b0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&b256_obj);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sk_obj);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&empty_obj);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sk_pubkey);
  return;
}

Assistant:

TEST(SchnorrPubkey, Constructor) {
  auto sk_pubkey = SchnorrPubkey::FromPrivkey(sk);
  SchnorrPubkey empty_obj;

  EXPECT_FALSE(empty_obj.IsValid());

  auto sk_obj = SchnorrPubkey::FromPrivkey(sk);
  SchnorrPubkey b256_obj(ByteData256(sk_pubkey.GetData()));

  EXPECT_EQ(sk_pubkey.GetHex(), sk_obj.GetHex());
  EXPECT_EQ(sk_pubkey.GetHex(), b256_obj.GetHex());
  EXPECT_TRUE(sk_obj.IsValid());
  EXPECT_TRUE(b256_obj.IsValid());
  EXPECT_TRUE(sk_obj.Equals(b256_obj));
}